

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsObject.c
# Opt level: O0

void JsStandardHasInstance(JsObject *self,JsValue *instance,JsValue *res)

{
  JsObject *local_40;
  JsObject *prototype;
  JsValue res0;
  JsValue *res_local;
  JsValue *instance_local;
  JsObject *self_local;
  
  if (instance->type == JS_OBJECT) {
    res0.u.reference.name = (char *)res;
    (*self->Get)(self,"prototype",(int *)0x0,(JsValue *)&prototype);
    if ((int)prototype == 5) {
      for (local_40 = ((instance->u).object)->Prototype; local_40 != (JsObject *)0x0;
          local_40 = local_40->Prototype) {
        if (local_40 == (JsObject *)res0._0_8_) {
          *(res0.u._8_8_ + 0) = '\x02';
          *(res0.u._8_8_ + 1) = '\0';
          *(res0.u._8_8_ + 2) = '\0';
          *(res0.u._8_8_ + 3) = '\0';
          *(res0.u._8_8_ + 8) = '\x01';
          *(res0.u._8_8_ + 9) = '\0';
          *(res0.u._8_8_ + 10) = '\0';
          *(res0.u._8_8_ + 0xb) = '\0';
          return;
        }
      }
      *(res0.u._8_8_ + 0) = '\x02';
      *(res0.u._8_8_ + 1) = '\0';
      *(res0.u._8_8_ + 2) = '\0';
      *(res0.u._8_8_ + 3) = '\0';
      *(res0.u._8_8_ + 8) = '\0';
      *(res0.u._8_8_ + 9) = '\0';
      *(res0.u._8_8_ + 10) = '\0';
      *(res0.u._8_8_ + 0xb) = '\0';
    }
    else {
      JsThrowString("TypeError");
    }
  }
  else {
    res->type = JS_BOOLEAN;
    (res->u).boolean = 0;
  }
  return;
}

Assistant:

void JsStandardHasInstance(struct JsObject *self, struct JsValue *instance,
			struct JsValue* res){
	struct JsValue res0;
	struct JsObject* prototype;
	if(instance->type != JS_OBJECT){
		res->type = JS_BOOLEAN;
		res->u.boolean = FALSE;
		return;
	}
	(*self->Get)(self,"prototype",NULL,&res0);
	if(res0.type != JS_OBJECT){
		JsThrowString("TypeError");
		return;
	}
	prototype = instance->u.object->Prototype;
	//循环查询
	while(prototype != NULL){
		if(prototype == res0.u.object){
			res->type = JS_BOOLEAN;
			res->u.boolean = TRUE;
			return;
		}
		//下一个对象的原形
		prototype = prototype->Prototype;
	}
	//没有查询到
	res->type = JS_BOOLEAN;
	res->u.boolean = FALSE;
}